

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O1

string * anon_unknown.dwarf_271c4::parent_dir(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::rfind((char)path,0x2f);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parent_dir(const std::string & path) {
	
	size_t pos = path.find_last_of(setup::path_sep);
	if(pos == std::string::npos) {
		return std::string();
	}
	
	return path.substr(0, pos);
}